

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O0

void updateMode(args *t,stateRecord *state)

{
  node *this;
  bool bVar1;
  __int_type key;
  node *node;
  stateRecord *state_local;
  args *t_local;
  
  this = (state->targetEdge).child;
  if (state->type == SIMPLE) {
    state->mode = CLEANUP;
  }
  else {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->readyToReplace);
    if (bVar1) {
      key = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)this);
      bVar1 = KeyMarked(key);
      if (!bVar1) {
        __assert_fail("KeyMarked(node->markedKey)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jaykhandare[P]A-fast-Lock-Free-Internal-Binary-Search-Tree/other_functions.h"
                      ,0x248,"void updateMode(struct args *, struct stateRecord *)");
      }
      state->mode = CLEANUP;
    }
    else {
      state->mode = DISCOVERY;
    }
  }
  return;
}

Assistant:

void updateMode(struct args* t,struct stateRecord* state)
{
    struct node* node;

    node = state->targetEdge.child;

    if(state->type == SIMPLE)
    {
        state->mode = CLEANUP;
    }
    else
    {
        if(node->readyToReplace)
        {
            assert(KeyMarked(node->markedKey));
            state->mode = CLEANUP;
        }
        else
        {
            state->mode = DISCOVERY;
        }
    }
    return;
}